

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_resp_handlers.cxx
# Opt level: O0

void __thiscall cornerstone::raft_server::handle_prevote_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int32 iVar2;
  element_type *peVar3;
  element_type *peVar4;
  pointer ppVar5;
  size_type sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *__s;
  allocator<char> *__a;
  raft_server *this_01;
  resp_msg *in_RSI;
  bool vote_added;
  shared_lock<std::shared_timed_mutex> rlock;
  mutex_type *in_stack_fffffffffffffd28;
  raft_server *in_stack_fffffffffffffd30;
  unsigned_long in_stack_fffffffffffffd38;
  strfmt<100> *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  prevote_state *in_stack_fffffffffffffd50;
  allocator<char> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  undefined1 local_221 [113];
  string local_1b0 [39];
  allocator<char> local_189;
  strfmt<100> local_188;
  string local_118 [32];
  undefined4 local_f8;
  allocator<char> local_f1;
  string local_f0 [39];
  undefined1 local_c9;
  allocator<char> local_a1;
  strfmt<100> local_a0;
  string local_30 [48];
  
  iVar2 = (int32)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_30._32_8_ = in_RSI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                      *)0x1dff83);
  if (bVar1) {
    std::shared_lock<std::shared_timed_mutex>::shared_lock
              ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffd30,
               in_stack_fffffffffffffd28);
    std::unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>::
    operator->((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                *)0x1e00fb);
    msg_base::get_src((msg_base *)local_30._32_8_);
    local_c9 = prevote_state::add_voted_server(in_stack_fffffffffffffd50,iVar2);
    if ((bool)local_c9) {
      bVar1 = resp_msg::get_accepted((resp_msg *)local_30._32_8_);
      if (bVar1) {
        ppVar5 = std::
                 unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                 ::operator->((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                               *)0x1e025d);
        prevote_state::inc_accepted_votes(ppVar5);
      }
      ppVar5 = std::
               unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
               ::operator->((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                             *)0x1e027d);
      iVar2 = prevote_state::get_accepted_votes(ppVar5);
      sVar6 = std::
              unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
              ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                      *)0x1e029f);
      if ((int)(sVar6 + 1 >> 1) < iVar2) {
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1e02c9);
        strfmt<100>::strfmt(&local_188,"Prevote passed for term %llu");
        peVar4 = std::
                 __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1e02f8);
        __s = (char *)srv_state::get_term(peVar4);
        __a = (allocator<char> *)
              strfmt<100>::fmt<unsigned_long>
                        ((strfmt<100> *)in_stack_fffffffffffffd30,
                         (unsigned_long)in_stack_fffffffffffffd28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
        (**(code **)(*(long *)this_00 + 0x18))(this_00,local_118);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator(&local_189);
        become_candidate(in_stack_fffffffffffffd30);
      }
      else {
        std::
        unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>::
        operator->((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                    *)0x1e03ee);
        this_01 = (raft_server *)prevote_state::num_of_votes((prevote_state *)0x1e03f6);
        sVar6 = std::
                unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                ::size((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                        *)0x1e0411);
        if ((raft_server *)(sVar6 + 1) <= this_01) {
          peVar3 = std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1e043a);
          strfmt<100>::strfmt((strfmt<100> *)(local_221 + 1),"Prevote failed for term %llu");
          peVar4 = std::
                   __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1e0469);
          srv_state::get_term(peVar4);
          strfmt<100>::fmt<unsigned_long>
                    ((strfmt<100> *)in_stack_fffffffffffffd30,
                     (unsigned_long)in_stack_fffffffffffffd28);
          in_stack_fffffffffffffd30 = (raft_server *)local_221;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
          (*peVar3->_vptr_logger[3])(peVar3,local_1b0);
          std::__cxx11::string::~string(local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)local_221);
          std::
          unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>::
          operator->((unique_ptr<cornerstone::prevote_state,_std::default_delete<cornerstone::prevote_state>_>
                      *)0x1e0502);
          prevote_state::reset((prevote_state *)in_stack_fffffffffffffd30);
          restart_election_timer(this_01);
        }
      }
      local_f8 = 0;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e0156);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      (*peVar3->_vptr_logger[3])(peVar3,local_f0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      local_f8 = 1;
    }
    std::shared_lock<std::shared_timed_mutex>::~shared_lock
              ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffd30);
  }
  else {
    peVar3 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1dff9f);
    strfmt<100>::strfmt(&local_a0,"Prevote has completed, term received: %llu, current term %llu");
    msg_base::get_term((msg_base *)local_30._32_8_);
    peVar4 = std::
             __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1dffec);
    srv_state::get_term(peVar4);
    strfmt<100>::fmt<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (unsigned_long)in_stack_fffffffffffffd30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    (*peVar3->_vptr_logger[3])(peVar3,local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void raft_server::handle_prevote_resp(resp_msg& resp)
{
    if (!prevote_state_)
    {
        l_->info(sstrfmt("Prevote has completed, term received: %llu, current term %llu")
                     .fmt(resp.get_term(), state_->get_term()));
        return;
    }

    {
        read_lock(peers_lock_);
        bool vote_added = prevote_state_->add_voted_server(resp.get_src());
        if (!vote_added)
        {
            l_->info("Prevote has from %d has been processed.");
            return;
        }

        if (resp.get_accepted())
        {
            prevote_state_->inc_accepted_votes();
        }

        if (prevote_state_->get_accepted_votes() > (int32)((peers_.size() + 1) / 2))
        {
            l_->info(sstrfmt("Prevote passed for term %llu").fmt(state_->get_term()));
            become_candidate();
        }
        else if (prevote_state_->num_of_votes() >= (peers_.size() + 1))
        {
            l_->info(sstrfmt("Prevote failed for term %llu").fmt(state_->get_term()));
            prevote_state_->reset();  // still in prevote state, just reset the prevote state
            restart_election_timer(); // restart election timer for a new round of prevote
        }
    }
}